

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O0

size_t __thiscall
helics::tcp::TcpCommsSS::dataReceive
          (TcpCommsSS *this,TcpConnection *connection,char *data,size_t bytes_received)

{
  bool bVar1;
  size_t sVar2;
  ulong in_RCX;
  TcpConnection *in_RSI;
  ActionMessage *in_RDI;
  size_t used;
  ActionMessage m;
  size_t used_total;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  ActionMessage *command;
  int local_f8;
  size_t in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  ActionMessage *in_stack_ffffffffffffff30;
  route_id *in_stack_ffffffffffffff38;
  Time in_stack_ffffffffffffff40;
  ulong local_28;
  
  local_28 = 0;
  do {
    if (in_RCX <= local_28) {
      return local_28;
    }
    command = (ActionMessage *)&stack0xffffffffffffff20;
    ActionMessage::ActionMessage(in_RDI);
    sVar2 = ActionMessage::depacketize
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
                      );
    if (sVar2 == 0) {
      local_f8 = 3;
    }
    else {
      bVar1 = isProtocolCommand(command);
      if (bVar1) {
        in_stack_fffffffffffffeec = gmlc::networking::TcpConnection::getIdentifier(in_RSI);
        ActionMessage::setExtraData(command,in_stack_fffffffffffffeec);
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
        ::emplace<helics::route_id_const&,helics::ActionMessage>
                  ((BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                    *)in_stack_ffffffffffffff40.internalTimeCode,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
      }
      else {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(helics::ActionMessage_&&)> *)command);
        if (bVar1) {
          std::function<void_(helics::ActionMessage_&&)>::operator()
                    ((function<void_(helics::ActionMessage_&&)> *)command,
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
          ;
        }
      }
      local_28 = sVar2 + local_28;
      local_f8 = 0;
    }
    ActionMessage::~ActionMessage(command);
  } while (local_f8 == 0);
  return local_28;
}

Assistant:

size_t TcpCommsSS::dataReceive(TcpConnection* connection, const char* data, size_t bytes_received)
{
    size_t used_total = 0;
    while (used_total < bytes_received) {
        ActionMessage m;
        auto used = m.depacketize(reinterpret_cast<const std::byte*>(data) + used_total,
                                  bytes_received - used_total);
        if (used == 0) {
            break;
        }
        if (isProtocolCommand(m)) {
            m.setExtraData(connection->getIdentifier());
            txQueue.emplace(control_route, std::move(m));
        } else {
            if (ActionCallback) {
                ActionCallback(std::move(m));
            }
        }
        used_total += used;
    }

    return used_total;
}